

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.c
# Opt level: O2

size_t exr_compress_max_buffer_size(size_t in_bytes)

{
  ulong uVar1;
  uint64_t uVar2;
  ulong uVar3;
  
  uVar1 = libdeflate_zlib_compress_bound(0,in_bytes);
  if (uVar1 < 0xfffffffffffffff7) {
    uVar1 = uVar1 + 9;
    if (uVar1 <= uVar1 * 0x82) {
      uVar3 = uVar1 * 0x82 >> 7;
      if (uVar3 <= uVar1) {
        uVar3 = uVar1;
      }
      uVar2 = internal_exr_huf_compress_spare_bytes();
      uVar1 = uVar2 + in_bytes;
      if (uVar2 + in_bytes < uVar3) {
        uVar1 = uVar3;
      }
      uVar2 = internal_exr_huf_decompress_spare_bytes();
      uVar3 = uVar2 + in_bytes;
      if (uVar2 + in_bytes < uVar1) {
        uVar3 = uVar1;
      }
      if (0x2000 < uVar3) {
        return uVar3;
      }
      return 0x2000;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t
exr_compress_max_buffer_size (size_t in_bytes)
{
    size_t r, extra;

    r = libdeflate_zlib_compress_bound (NULL, in_bytes);
    /*
     * lib deflate has a message about needing a 9 byte boundary
     * but is unclear if it actually adds that or not
     * (see the comment on libdeflate_deflate_compress)
     */
    if (r > (SIZE_MAX - 9)) return (size_t) (SIZE_MAX);
    r += 9;

    /*
     * old library had uiAdd( uiAdd( in, ceil(in * 0.01) ), 100 )
     */
    extra = (r * (size_t) 130);
    if (extra < r) return (size_t) (SIZE_MAX);
    extra /= (size_t) 128;

    if (extra > (SIZE_MAX - 100)) return (size_t) (SIZE_MAX);
    if (extra > r) r = extra;

    /*
     * in case huf is larger than zlib
     */
    extra = in_bytes + internal_exr_huf_compress_spare_bytes ();
    if (r < extra) r = extra;

    extra = in_bytes + internal_exr_huf_decompress_spare_bytes ();
    if (r < extra) r = extra;

    /* make sure there is some small 2 pages worth of buffer */
    if (8192 > r) r = 8192;

    return r;
}